

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_Module.cpp
# Opt level: O1

pool_ptr<soul::heart::OutputDeclaration> __thiscall
soul::Module::findOutput(Module *this,string_view name)

{
  long *plVar1;
  bool bVar2;
  ProgramImpl *pPVar3;
  char *in_RCX;
  long *plVar4;
  bool bVar5;
  string_view other;
  string_view other_00;
  
  plVar4 = *(long **)(name._M_len + 0x88);
  plVar1 = *(long **)(name._M_len + 0x90);
  bVar5 = plVar4 == plVar1;
  if (!bVar5) {
    other._M_str = in_RCX;
    other._M_len = (size_t)name._M_str;
    bVar2 = Identifier::operator==((Identifier *)(*plVar4 + 0x18),other);
    while (!bVar2) {
      plVar4 = plVar4 + 1;
      bVar5 = plVar4 == plVar1;
      if (bVar5) goto LAB_001b0945;
      other_00._M_str = in_RCX;
      other_00._M_len = (size_t)name._M_str;
      bVar2 = Identifier::operator==((Identifier *)(*plVar4 + 0x18),other_00);
    }
    if (!bVar5) {
      pPVar3 = (ProgramImpl *)*plVar4;
      goto LAB_001b094d;
    }
  }
LAB_001b0945:
  pPVar3 = (ProgramImpl *)0x0;
LAB_001b094d:
  (this->program).pimpl = pPVar3;
  return (pool_ptr<soul::heart::OutputDeclaration>)(OutputDeclaration *)this;
}

Assistant:

pool_ptr<heart::OutputDeclaration> Module::findOutput (std::string_view name) const
{
    for (auto& f : outputs)
        if (f->name == name)
            return f;

    return {};
}